

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenReceiver(GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  long *plVar1;
  long *plVar2;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  long *local_38 [2];
  long local_28 [2];
  
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_38,&this->namer_,struct_def);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x36bce1);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_68 = *plVar2;
    lStack_60 = plVar1[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar2;
    local_78 = (long *)*plVar1;
  }
  local_70 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  local_50 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void GenReceiver(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "func (rcv *" + namer_.Type(struct_def) + ")";
  }